

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O0

Node * __thiscall wabt::Node::operator=(Node *this,Node *rhs)

{
  Node *rhs_local;
  Node *this_local;
  
  this->ntype = rhs->ntype;
  rhs->ntype = Uninitialized;
  this->etype = rhs->etype;
  rhs->etype = Nop;
  this->e = rhs->e;
  std::swap<wabt::Node,std::allocator<wabt::Node>>(&this->children,&rhs->children);
  this->u = rhs->u;
  return this;
}

Assistant:

Node& operator=(Node&& rhs) {
    ntype = rhs.ntype;
    // Reset ntype to avoid moved from values still being used.
    rhs.ntype = NodeType::Uninitialized;
    etype = rhs.etype;
    rhs.etype = ExprType::Nop;
    e = rhs.e;
    std::swap(children, rhs.children);
    u = rhs.u;
    return *this;
  }